

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

SymOpnd * __thiscall
IRBuilderAsmJs::BuildAsmJsLoopBodySlotOpnd(IRBuilderAsmJs *this,RegSlot regSlot,IRType opndType)

{
  code *pcVar1;
  bool bVar2;
  IRType type;
  PropertyId propertyId;
  undefined4 *puVar3;
  StackSym *pSVar4;
  PropertySym *sym;
  SymOpnd *pSVar5;
  
  bVar2 = IsLoopBody(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xde4,"(IsLoopBody())","IsLoopBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  type = IRType_EnsureSigned(opndType);
  pSVar4 = Func::EnsureLoopParamSym(this->m_func);
  propertyId = CalculatePropertyOffset(this,regSlot,type);
  sym = PropertySym::FindOrCreate
                  ((pSVar4->super_Sym).m_id,propertyId,0xffffffff,0xffffffff,PropertyKindLocalSlots,
                   this->m_func);
  pSVar5 = IR::SymOpnd::New(&sym->super_Sym,type,this->m_func);
  return pSVar5;
}

Assistant:

IR::SymOpnd *
IRBuilderAsmJs::BuildAsmJsLoopBodySlotOpnd(Js::RegSlot regSlot, IRType opndType)
{
    Assert(IsLoopBody());
    // There is no unsigned locals, make sure we create only signed locals
    opndType = IRType_EnsureSigned(opndType);
    // Get the interpreter frame instance that was passed in.
    StackSym *loopParamSym = m_func->EnsureLoopParamSym();

    // property ID is the offset
    Js::PropertyId propOffSet = CalculatePropertyOffset(regSlot, opndType);

    // Get the bytecodeRegSlot and Get the offset from m_localSlots
    PropertySym * fieldSym = PropertySym::FindOrCreate(loopParamSym->m_id, propOffSet, (uint32)-1, (uint)-1, PropertyKindLocalSlots, m_func);
    return IR::SymOpnd::New(fieldSym, opndType, m_func);
}